

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.cpp
# Opt level: O1

void __thiscall GrcManager::Init(GrcManager *this)

{
  _Rb_tree_header *p_Var1;
  GdlRenderer *this_00;
  GrcSymbolTable *this_01;
  GrcMasterTable *pGVar2;
  GrcMasterValueList *pGVar3;
  long *local_70;
  long local_68;
  long local_60 [2];
  undefined8 local_50;
  long *local_48 [2];
  long local_38 [2];
  
  this_00 = (GdlRenderer *)operator_new(0x118);
  GdlRenderer::GdlRenderer(this_00);
  this->m_prndr = this_00;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  local_50 = 0x100000001;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)local_48,local_70,local_68 + (long)local_70);
  (this_00->super_GdlObject).m_lnf.m_nLinePre = (undefined4)local_50;
  (this_00->super_GdlObject).m_lnf.m_nLineOrig = local_50._4_4_;
  std::__cxx11::string::_M_assign((string *)&(this_00->super_GdlObject).m_lnf.m_staFile);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  this_01 = (GrcSymbolTable *)operator_new(0x40);
  GrcSymbolTable::GrcSymbolTable(this_01,true);
  this->m_psymtbl = this_01;
  std::vector<GrcEnv,_std::allocator<GrcEnv>_>::resize(&this->m_venv,1);
  pGVar2 = (GrcMasterTable *)operator_new(0x30);
  p_Var1 = &(pGVar2->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header;
  (pGVar2->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pGVar2->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pGVar2->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pGVar2->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (pGVar2->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_mtbGlyphAttrs = pGVar2;
  pGVar2 = (GrcMasterTable *)operator_new(0x30);
  p_Var1 = &(pGVar2->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header;
  (pGVar2->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pGVar2->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pGVar2->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pGVar2->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (pGVar2->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_mtbFeatures = pGVar2;
  pGVar3 = (GrcMasterValueList *)operator_new(0x30);
  p_Var1 = &(pGVar3->m_valmapEntries)._M_t._M_impl.super__Rb_tree_header;
  (pGVar3->m_valmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pGVar3->m_valmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pGVar3->m_valmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pGVar3->m_valmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (pGVar3->m_valmapEntries)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_mvlNameStrings = pGVar3;
  this->m_pgax = (GrcGlyphAttrMatrix *)0x0;
  this->m_plclist = (GrcLigComponentList *)0x0;
  this->m_prgvpglfcFsmClasses =
       (vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)0x0;
  this->m_fOutputDebugFiles = false;
  this->m_fOutputDebugXml = false;
  this->m_fBasicJust = false;
  this->m_nNameTblStart = -1;
  this->m_fxdSilfTableVersion = 0;
  this->m_tcCompressor = ktcNone;
  this->m_fxdGlocTableVersion = 0;
  this->m_fxdGlatTableVersion = 0;
  this->m_fxdFeatTableVersion = 0;
  this->m_fxdSillTableVersion = 0;
  return;
}

Assistant:

void GrcManager::Init()
{
	m_prndr = new GdlRenderer();
	m_prndr->SetLineAndFile(GrpLineAndFile(1, 1, ""));

	m_psymtbl = new GrcSymbolTable(true);

	m_venv.resize(1);

	//	Temporary structures used during parsing:
	m_mtbGlyphAttrs = new GrcMasterTable;
	m_mtbFeatures = new GrcMasterTable;
	m_mvlNameStrings = new GrcMasterValueList;

	m_pgax = NULL;
	m_plclist = NULL;

	m_prgvpglfcFsmClasses = NULL;

	m_fOutputDebugFiles = false;
	m_fOutputDebugXml = false;
	m_fBasicJust = false;

	m_nNameTblStart = -1;

	m_fxdSilfTableVersion = 0;
	m_fxdGlocTableVersion = 0;
	m_fxdGlatTableVersion = 0;
	m_fxdFeatTableVersion = 0;
	m_fxdSillTableVersion = 0;
	m_tcCompressor = ktcNone;
}